

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O0

void __thiscall FStateDefinitions::AddStateDefines(FStateDefinitions *this,FStateLabels *list)

{
  FStateDefine *pFVar1;
  undefined1 local_48 [8];
  FStateDefine def;
  int i;
  FStateLabels *list_local;
  FStateDefinitions *this_local;
  
  if (list != (FStateLabels *)0x0) {
    for (def._36_4_ = 0; (int)def._36_4_ < list->NumLabels; def._36_4_ = def._36_4_ + 1) {
      if (list->Labels[(int)def._36_4_].Children == (FStateLabels *)0x0) {
        FName::FName((FName *)&def.DefineFlags,&list->Labels[(int)def._36_4_].Label);
        pFVar1 = FindStateLabelInList(&this->StateLabels,(FName *)&def.DefineFlags,false);
        if (pFVar1 == (FStateDefine *)0x0) {
          FStateDefine::FStateDefine((FStateDefine *)local_48);
          FName::operator=((FName *)local_48,&list->Labels[(int)def._36_4_].Label);
          def.Children._8_8_ = list->Labels[(int)def._36_4_].State;
          def.State._0_1_ = 1;
          TArray<FStateDefine,_FStateDefine>::Push(&this->StateLabels,(FStateDefine *)local_48);
          FStateDefine::~FStateDefine((FStateDefine *)local_48);
        }
      }
    }
  }
  return;
}

Assistant:

void FStateDefinitions::AddStateDefines(const FStateLabels *list)
{
	if (list != NULL) for(int i = 0; i < list->NumLabels; i++)
	{
		if (list->Labels[i].Children == NULL)
		{
			if (!FindStateLabelInList(StateLabels, list->Labels[i].Label, false))
			{
				FStateDefine def;

				def.Label = list->Labels[i].Label;
				def.State = list->Labels[i].State;
				def.DefineFlags = SDF_STATE;
				StateLabels.Push(def);
			}
		}
	}
}